

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_demotion.c
# Opt level: O0

value value_type_demotion_integer(value v,type_id id)

{
  type_id id_00;
  int iVar1;
  value pvVar2;
  type_id in_ESI;
  value in_RDI;
  type_id v_id;
  value demotion;
  char buffer [8];
  type_id id_01;
  undefined1 *v_00;
  void *in_stack_ffffffffffffffc8;
  undefined1 *data;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_1c [8];
  type_id local_14;
  value local_10;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_1c,0,8);
  id_00 = value_type_id((value)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  iVar1 = type_id_integer(id_00);
  if (((iVar1 != 0) || (iVar1 = type_id_integer(local_14), iVar1 != 0)) || (id_00 < local_14)) {
    return (value)0x0;
  }
  if (id_00 == local_14) {
    return local_10;
  }
  v_00 = local_1c;
  id_01 = (type_id)((ulong)local_10 >> 0x20);
  value_type_id_size(id_01);
  value_to((value)CONCAT44(id_00,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,(size_t)v_00);
  data = local_1c;
  value_type_id_size(id_01);
  pvVar2 = value_type_create(data,(size_t)v_00,id_01);
  if (pvVar2 == (value)0x0) {
    return local_10;
  }
  value_destroy(v_00);
  return pvVar2;
}

Assistant:

value value_type_demotion_integer(value v, type_id id)
{
	char buffer[8] = { 0 };

	value demotion = NULL;

	type_id v_id = value_type_id(v);

	if (type_id_integer(v_id) != 0 || type_id_integer(id) != 0 || v_id < id)
	{
		return NULL;
	}

	if (v_id == id)
	{
		return v;
	}

	value_to(v, (void *)&buffer[0], value_type_id_size(v_id));

	demotion = value_type_create((void *)&buffer[0], value_type_id_size(id), id);

	if (demotion == NULL)
	{
		return v;
	}

	value_destroy(v);

	return demotion;
}